

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (FLAGS_gtest_stream_result_to_abi_cxx11_._8_8_ != 0) {
    lVar1 = std::__cxx11::string::find(-0x20,0x3a);
    if (lVar1 == -1) {
      GTestLog::GTestLog((GTestLog *)&local_60,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                         ,0x1356);
      poVar2 = std::operator<<((ostream *)&std::cerr,"unrecognized streaming target \"");
      poVar2 = std::operator<<(poVar2,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
      std::operator<<(poVar2,"\" ignored.");
      GTestLog::~GTestLog((GTestLog *)&local_60);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_60,0x1427e0);
      std::__cxx11::string::substr((ulong)&local_40,0x1427e0);
      StreamingListener::StreamingListener(this_00,&local_60,&local_40);
      TestEventListeners::Append(&this->listeners_,(TestEventListener *)this_00);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return;
}

Assistant:

std::string Message::GetString() const {
  return internal::StringStreamToString(ss_.get());
}